

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_ea_ea(m68k_info *info,int opcode,int size)

{
  cs_m68k *op;
  
  op = build_init_op(info,0x119,2,opcode);
  get_ea_mode_op(info,op->operands,info->ir,opcode);
  get_ea_mode_op(info,op->operands + 1,info->ir >> 3 & 0x38 | info->ir >> 9 & 7,opcode);
  return;
}

Assistant:

static void build_ea_ea(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, size);
	get_ea_mode_op(info, op1, (((info->ir>>9) & 7) | ((info->ir>>3) & 0x38)), size);
}